

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O0

QColor __thiscall QFusionStylePrivate::outline(QFusionStylePrivate *this,QPalette *pal)

{
  long lVar1;
  QColor QVar2;
  BrushStyle BVar3;
  QColor *pQVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff4;
  undefined2 in_stack_fffffffffffffff6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPalette::window((QPalette *)0x4f814a);
  BVar3 = QBrush::style((QBrush *)0x4f8152);
  if (BVar3 == TexturePattern) {
    QColor::QColor((QColor *)
                   CONCAT26(in_stack_fffffffffffffff6,
                            CONCAT24(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)),
                   (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(int)in_stack_ffffffffffffffe8,
                   (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(int)in_stack_ffffffffffffffe0);
  }
  else {
    QPalette::window((QPalette *)0x4f8179);
    pQVar4 = QBrush::color((QBrush *)0x4f8181);
    auVar5 = QColor::darker((int)pQVar4);
    in_stack_ffffffffffffffe8 = auVar5._0_8_;
    in_stack_fffffffffffffff0 = auVar5._8_4_;
    in_stack_fffffffffffffff4 = auVar5._12_2_;
  }
  QVar2.ct.argb.pad = in_stack_fffffffffffffff4;
  QVar2.ct._4_4_ = in_stack_fffffffffffffff0;
  QVar2._14_2_ = in_stack_fffffffffffffff6;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._0_8_ = in_stack_ffffffffffffffe8;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QColor outline(const QPalette &pal) const {
        if (pal.window().style() == Qt::TexturePattern)
            return QColor(0, 0, 0, 160);
        return pal.window().color().darker(140);
    }